

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::set(EntryImpl *this,Own<const_kj::File> *value)

{
  Own<const_kj::File> local_18;
  
  local_18.disposer = value->disposer;
  local_18.ptr = value->ptr;
  value->ptr = (File *)0x0;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  ::
  init<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::FileNode>
            ((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
              *)&this->node,(FileNode *)&local_18);
  Own<const_kj::File>::dispose(&local_18);
  return;
}

Assistant:

void set(Own<const File>&& value) {
      node.init<FileNode>(FileNode { kj::mv(value) });
    }